

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void closegoto(LexState *ls,int g,Labeldesc *label)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Dyndata *pDVar3;
  undefined8 uVar4;
  long lVar5;
  LocVar *pLVar6;
  char *msg;
  long lVar7;
  Labeldesc *pLVar8;
  long lVar9;
  
  pDVar3 = ls->dyd;
  lVar9 = (long)g;
  lVar7 = lVar9 * 0x18;
  pLVar8 = (pDVar3->gt).arr;
  if (pLVar8[lVar9].name != label->name) {
    __assert_fail("((gt->name) == (label->name))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x315,"void closegoto(LexState *, int, Labeldesc *)");
  }
  pLVar8 = pLVar8 + lVar9;
  if (label->nactvar <= pLVar8->nactvar) {
    luaK_patchlist(ls->fs,pLVar8->pc,label->pc);
    for (; lVar5 = (long)(pDVar3->gt).n + -1, lVar9 < lVar5; lVar9 = lVar9 + 1) {
      pLVar8 = (pDVar3->gt).arr;
      *(undefined8 *)(&pLVar8->nactvar + lVar7) = *(undefined8 *)(&pLVar8[1].nactvar + lVar7);
      puVar2 = (undefined8 *)((long)&pLVar8[1].name + lVar7);
      uVar4 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pLVar8->name + lVar7);
      *puVar1 = *puVar2;
      puVar1[1] = uVar4;
      lVar7 = lVar7 + 0x18;
    }
    (pDVar3->gt).n = (int)lVar5;
    return;
  }
  pLVar6 = getlocvar(ls->fs,(uint)pLVar8->nactvar);
  msg = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                         pLVar8->name + 1,(ulong)(uint)pLVar8->line,pLVar6->varname + 1);
  semerror(ls,msg);
}

Assistant:

static void closegoto (LexState *ls, int g, Labeldesc *label) {
  int i;
  FuncState *fs = ls->fs;
  Labellist *gl = &ls->dyd->gt;
  Labeldesc *gt = &gl->arr[g];
  lua_assert(eqstr(gt->name, label->name));
  if (gt->nactvar < label->nactvar) {
    TString *vname = getlocvar(fs, gt->nactvar)->varname;
    const char *msg = luaO_pushfstring(ls->L,
      "<goto %s> at line %d jumps into the scope of local '%s'",
      getstr(gt->name), gt->line, getstr(vname));
    semerror(ls, msg);
  }
  luaK_patchlist(fs, gt->pc, label->pc);
  /* remove goto from pending list */
  for (i = g; i < gl->n - 1; i++)
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}